

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOrderDirectories.cxx
# Opt level: O1

void __thiscall
cmOrderDirectories::AddRuntimeLibrary(cmOrderDirectories *this,string *fullPath,char *soname)

{
  pointer *pppcVar1;
  _Rb_tree_header *p_Var2;
  iterator iVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  string *__k;
  iterator iVar7;
  cmOrderDirectoriesConstraintSOName *pcVar8;
  bool bVar9;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar10;
  string dir;
  cmOrderDirectoriesConstraintSOName *local_b0;
  undefined8 local_a8;
  undefined1 local_a0;
  undefined7 uStack_9f;
  string local_90;
  string local_70 [8];
  _Alloc_hider local_68;
  undefined1 local_60;
  undefined7 uStack_5f;
  string local_50 [8];
  _Alloc_hider local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pVar10 = std::
           _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
           ::_M_insert_unique<std::__cxx11::string_const&>
                     ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                       *)&this->EmmittedConstraintSOName,fullPath);
  if (((undefined1  [16])pVar10 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    if ((this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
      cmsys::SystemTools::GetFilenamePath(&local_90,fullPath);
      lVar6 = std::__cxx11::string::rfind((char *)fullPath,0x553fef,0xffffffffffffffff);
      if (lVar6 != -1) {
        if ((AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::splitFramework == '\0') &&
           (iVar5 = __cxa_guard_acquire(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)
                                         ::splitFramework), iVar5 != 0)) {
          AddRuntimeLibrary::splitFramework.program = (char *)0x0;
          cmsys::RegularExpression::compile
                    (&AddRuntimeLibrary::splitFramework,"^(.*)/(.*).framework/(.*)$");
          __cxa_atexit(cmsys::RegularExpression::~RegularExpression,
                       &AddRuntimeLibrary::splitFramework,&__dso_handle);
          __cxa_guard_release(&AddRuntimeLibrary(std::__cxx11::string_const&,char_const*)::
                               splitFramework);
        }
        bVar4 = cmsys::RegularExpression::find
                          (&AddRuntimeLibrary::splitFramework,(fullPath->_M_dataplus)._M_p);
        if (bVar4) {
          if (AddRuntimeLibrary::splitFramework.startp[3] == (char *)0x0) {
            local_70 = (string  [8])&local_60;
            local_68._M_p = (pointer)0x0;
            local_60 = 0;
          }
          else {
            local_70 = (string  [8])&local_60;
            std::__cxx11::string::_M_construct<char_const*>
                      (local_70,AddRuntimeLibrary::splitFramework.startp[3],
                       AddRuntimeLibrary::splitFramework.endp[3]);
          }
          if (AddRuntimeLibrary::splitFramework.startp[2] == (char *)0x0) {
            local_50 = (string  [8])&local_40;
            local_48._M_p = (pointer)0x0;
            local_40 = 0;
          }
          else {
            local_50 = (string  [8])&local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      (local_50,AddRuntimeLibrary::splitFramework.startp[2],
                       AddRuntimeLibrary::splitFramework.endp[2]);
          }
          lVar6 = std::__cxx11::string::find((char *)local_70,(ulong)local_50,0);
          bVar9 = lVar6 != -1;
        }
        else {
          bVar9 = false;
        }
        if (bVar4) {
          if (local_50 != (string  [8])&local_40) {
            operator_delete((void *)local_50,CONCAT71(uStack_3f,local_40) + 1);
          }
          if (local_70 != (string  [8])&local_60) {
            operator_delete((void *)local_70,CONCAT71(uStack_5f,local_60) + 1);
          }
        }
        if (bVar9) {
          local_b0 = (cmOrderDirectoriesConstraintSOName *)&local_a0;
          if (AddRuntimeLibrary::splitFramework.startp[1] == (char *)0x0) {
            local_a8 = 0;
            local_a0 = 0;
          }
          else {
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_b0,AddRuntimeLibrary::splitFramework.startp[1],
                       AddRuntimeLibrary::splitFramework.endp[1]);
          }
          std::__cxx11::string::operator=((string *)&local_90,(string *)&local_b0);
          if (local_b0 != (cmOrderDirectoriesConstraintSOName *)&local_a0) {
            operator_delete(local_b0,CONCAT71(uStack_9f,local_a0) + 1);
          }
        }
      }
      __k = GetRealPath(this,&local_90);
      iVar7 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::find(&(this->ImplicitDirectories)._M_t,__k);
      p_Var2 = &(this->ImplicitDirectories)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar7._M_node != p_Var2) {
        pcVar8 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
        cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
                  (pcVar8,this,fullPath,soname);
        iVar3._M_current =
             (this->ImplicitDirEntries).
             super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        local_b0 = pcVar8;
        if (iVar3._M_current ==
            (this->ImplicitDirEntries).
            super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
          _M_realloc_insert<cmOrderDirectoriesConstraint*>
                    ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                      *)&this->ImplicitDirEntries,iVar3,(cmOrderDirectoriesConstraint **)&local_b0);
        }
        else {
          *iVar3._M_current = (cmOrderDirectoriesConstraint *)pcVar8;
          pppcVar1 = &(this->ImplicitDirEntries).
                      super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppcVar1 = *pppcVar1 + 1;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if ((_Rb_tree_header *)iVar7._M_node != p_Var2) {
        return;
      }
    }
    pcVar8 = (cmOrderDirectoriesConstraintSOName *)operator_new(0xa0);
    cmOrderDirectoriesConstraintSOName::cmOrderDirectoriesConstraintSOName
              (pcVar8,this,fullPath,soname);
    iVar3._M_current =
         (this->ConstraintEntries).
         super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->ConstraintEntries).
        super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      local_90._M_dataplus._M_p = (pointer)pcVar8;
      std::vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>::
      _M_realloc_insert<cmOrderDirectoriesConstraint*>
                ((vector<cmOrderDirectoriesConstraint*,std::allocator<cmOrderDirectoriesConstraint*>>
                  *)&this->ConstraintEntries,iVar3,(cmOrderDirectoriesConstraint **)&local_90);
    }
    else {
      *iVar3._M_current = (cmOrderDirectoriesConstraint *)pcVar8;
      pppcVar1 = &(this->ConstraintEntries).
                  super__Vector_base<cmOrderDirectoriesConstraint_*,_std::allocator<cmOrderDirectoriesConstraint_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppcVar1 = *pppcVar1 + 1;
    }
  }
  return;
}

Assistant:

void cmOrderDirectories::AddRuntimeLibrary(std::string const& fullPath,
                                           const char* soname)
{
  // Add the runtime library at most once.
  if (this->EmmittedConstraintSOName.insert(fullPath).second) {
    // Implicit link directories need special handling.
    if (!this->ImplicitDirectories.empty()) {
      std::string dir = cmSystemTools::GetFilenamePath(fullPath);

      if (fullPath.rfind(".framework") != std::string::npos) {
        static cmsys::RegularExpression splitFramework(
          "^(.*)/(.*).framework/(.*)$");
        if (splitFramework.find(fullPath) &&
            (std::string::npos !=
             splitFramework.match(3).find(splitFramework.match(2)))) {
          dir = splitFramework.match(1);
        }
      }

      if (this->IsImplicitDirectory(dir)) {
        this->ImplicitDirEntries.push_back(
          new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
        return;
      }
    }

    // Construct the runtime information entry for this library.
    this->ConstraintEntries.push_back(
      new cmOrderDirectoriesConstraintSOName(this, fullPath, soname));
  } else {
    // This can happen if the same library is linked multiple times.
    // In that case the runtime information check need be done only
    // once anyway.  For shared libs we could add a check in AddItem
    // to not repeat them.
  }
}